

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestCoverageCommand::CheckArgumentKeyword(cmCTestCoverageCommand *this,string *arg)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)arg);
  if (iVar2 != 0) {
    bVar1 = cmCTestHandlerCommand::CheckArgumentKeyword(&this->super_cmCTestHandlerCommand,arg);
    return bVar1;
  }
  (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
  this->LabelsMentioned = true;
  return true;
}

Assistant:

bool cmCTestCoverageCommand::CheckArgumentKeyword(std::string const& arg)
{
  // Look for arguments specific to this command.
  if(arg == "LABELS")
    {
    this->ArgumentDoing = ArgumentDoingLabels;
    this->LabelsMentioned = true;
    return true;
    }

  // Look for other arguments.
  return this->Superclass::CheckArgumentKeyword(arg);
}